

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O2

size_t __thiscall
adios2::burstbuffer::FileDrainer::Write
          (FileDrainer *this,OutputFile *f,size_t count,char *buffer,string *path)

{
  element_type *peVar1;
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::ostream::write((char *)(f->
                              super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,(long)buffer);
  peVar1 = (f->
           super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (((byte)peVar1[*(long *)(*(long *)peVar1 + -0x18) + 0x20] & 1) != 0) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_119);
    std::__cxx11::string::string((string *)&local_58,"BurstBuffer::FileDrainer",&local_11a);
    std::__cxx11::string::string((string *)&local_78,"Write",&local_11b);
    std::operator+(&local_f8,"FileDrainer couldn\'t write to file ",path);
    std::operator+(&local_d8,&local_f8," count = ");
    std::__cxx11::to_string(&local_118,count);
    std::operator+(&local_b8,&local_d8,&local_118);
    std::operator+(&local_98,&local_b8," bytes");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return count;
}

Assistant:

size_t FileDrainer::Write(OutputFile &f, size_t count, const char *buffer, const std::string &path)
{
    f->write(buffer, static_cast<std::streamsize>(count));

    if (f->bad())
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "BurstBuffer::FileDrainer", "Write",
                                              "FileDrainer couldn't write to file " + path +
                                                  " count = " + std::to_string(count) + " bytes");
    }

    return count;
}